

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

nn_optset * nn_tcp_optset(void)

{
  nn_optset *pnVar1;
  nn_tcp_optset *optset;
  
  pnVar1 = (nn_optset *)nn_alloc_(0x2fbeab);
  if (pnVar1 == (nn_optset *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/tcp.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar1->vfptr = &nn_tcp_optset_vfptr;
  *(undefined4 *)&pnVar1[1].vfptr = 0;
  return pnVar1;
}

Assistant:

static struct nn_optset *nn_tcp_optset ()
{
    struct nn_tcp_optset *optset;

    optset = nn_alloc (sizeof (struct nn_tcp_optset), "optset (tcp)");
    alloc_assert (optset);
    optset->base.vfptr = &nn_tcp_optset_vfptr;

    /*  Default values for TCP socket options. */
    optset->nodelay = 0;

    return &optset->base;   
}